

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Oscilloscope.cpp
# Opt level: O3

int Oscilloscope::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  void *pvVar1;
  bool bVar2;
  int numsamplesSource;
  
  pvVar1 = (state->field_0).field_0.effectdata;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = Oscilloscope::EffectData]");
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    bVar2 = 1.0 <= *(float *)((long)pvVar1 + 8);
    numsamplesSource = 0x1000;
    if (!bVar2) {
      numsamplesSource = numsamples;
    }
    HistoryBuffer::ReadBuffer
              ((HistoryBuffer *)((long)pvVar1 + (long)name[7] * 0x10 + (ulong)bVar2 * 0x80 + -0x2f0)
               ,buffer,numsamples,numsamplesSource,0.0);
    return 0;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,
                "T *UnityAudioEffectState::GetEffectData() const [T = Oscilloscope::EffectData]");
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        int channel = name[7] - '0';
        if (data->p[P_Mode] >= 1.0f)
            data->spectrum[channel].ReadBuffer(buffer, numsamples, FFTSIZE / 2, 0.0f);
        else
            data->history[channel].ReadBuffer(buffer, numsamples, numsamples, 0.0f);
        return UNITY_AUDIODSP_OK;
    }